

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

err_t rngESTest(char *source)

{
  bool_t bVar1;
  size_t read;
  octet buf [2500];
  err_t code;
  size_t in_stack_fffffffffffff618;
  void *in_stack_fffffffffffff620;
  size_t *in_stack_fffffffffffff628;
  octet *in_stack_fffffffffffff630;
  octet *in_stack_fffffffffffff660;
  octet *in_stack_fffffffffffff6c0;
  err_t local_14;
  
  local_14 = rngESRead(in_stack_fffffffffffff628,in_stack_fffffffffffff620,in_stack_fffffffffffff618
                       ,(char *)0x117fbb);
  if ((local_14 == 0) && (in_stack_fffffffffffff620 != (void *)0x9c4)) {
    local_14 = 0xcf;
  }
  if (local_14 == 0) {
    bVar1 = rngTestFIPS1(in_stack_fffffffffffff630);
    if ((((bVar1 == 0) || (bVar1 = rngTestFIPS2(in_stack_fffffffffffff660), bVar1 == 0)) ||
        (bVar1 = rngTestFIPS3(in_stack_fffffffffffff6c0), bVar1 == 0)) ||
       (bVar1 = rngTestFIPS4(&stack0xfffffffffffff628), bVar1 == 0)) {
      local_14 = 0x20b;
    }
    memWipe(in_stack_fffffffffffff630,(size_t)in_stack_fffffffffffff628);
    return local_14;
  }
  return local_14;
}

Assistant:

err_t rngESTest(const char* source)
{
	err_t code;
	octet buf[2500];
	size_t read;
	// прочитать данные от источника
	code = rngESRead(&read, buf, 2500, source);
	if (code == ERR_OK && read != 2500)
		code = ERR_FILE_READ;
	ERR_CALL_CHECK(code);
	// статистическое тестирование
	if (!rngTestFIPS1(buf) || !rngTestFIPS2(buf) || !rngTestFIPS3(buf) ||
		!rngTestFIPS4(buf))
		code = ERR_STATTEST;
	// завершение
	memWipe(buf, sizeof(buf));
	return code;
}